

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::LSR_ZP_X(CPU *this)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  
  this->cycles = 6;
  iVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 3;
  uVar3 = (uint)(byte)((char)iVar1 + this->X);
  iVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar3);
  bVar2 = (byte)iVar1;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (bVar2 < 2) * '\x02' | (this->field_6).ps & 0x7c | bVar2 & 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)uVar3,(ulong)(bVar2 >> 1));
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::LSR_ZP_X()
{
    cycles = 6;
    uint8_t addr = GetByte() + X;
    cycles--;
    uint8_t data = ReadByte(addr);
    C = (data & 0b00000001) > 0;
    data >>= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}